

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test8(void)

{
  bool bVar1;
  bool local_9a;
  int local_98;
  int local_94;
  int i_6;
  int i_5;
  int local_88;
  int i_4;
  int local_80;
  int i_3;
  int c;
  int i_2;
  int local_70;
  int i_1;
  int local_68;
  int i;
  int b2;
  int b1;
  int same;
  int f2;
  int f1;
  undefined1 local_48 [8];
  queue<int> b;
  queue<int> a;
  
  srand(0);
  CP::queue<int>::queue((queue<int> *)&b.mFront);
  CP::queue<int>::queue((queue<int> *)local_48);
  same = 200;
  b1 = 10;
  b2 = 900;
  i = 100;
  local_68 = 10;
  for (i_1 = 0; i_1 < same; i_1 = i_1 + 1) {
    local_70 = rand();
    CP::queue<int>::push((queue<int> *)&b.mFront,&local_70);
  }
  for (i_2 = 0; i_2 < b1; i_2 = i_2 + 1) {
    c = rand();
    CP::queue<int>::push((queue<int> *)local_48,&c);
  }
  for (i_3 = 0; i_3 < b2; i_3 = i_3 + 1) {
    local_80 = rand();
    CP::queue<int>::push((queue<int> *)&b.mFront,&local_80);
    CP::queue<int>::push((queue<int> *)local_48,&local_80);
  }
  for (i_4 = 0; i_4 < i; i_4 = i_4 + 1) {
    local_88 = rand();
    CP::queue<int>::push((queue<int> *)&b.mFront,&local_88);
  }
  for (i_5 = 0; i_5 < local_68; i_5 = i_5 + 1) {
    i_6 = rand();
    CP::queue<int>::push((queue<int> *)local_48,&i_6);
  }
  for (local_94 = 0; local_94 < same; local_94 = local_94 + 1) {
    CP::queue<int>::pop((queue<int> *)&b.mFront);
  }
  for (local_98 = 0; local_98 < b1; local_98 = local_98 + 1) {
    CP::queue<int>::pop((queue<int> *)local_48);
  }
  bVar1 = CP::queue<int>::operator==((queue<int> *)&b.mFront,(queue<int> *)local_48);
  local_9a = false;
  if (!bVar1) {
    local_9a = CP::queue<int>::operator==((queue<int> *)local_48,(queue<int> *)&b.mFront);
    local_9a = !local_9a;
  }
  CP::queue<int>::~queue((queue<int> *)local_48);
  CP::queue<int>::~queue((queue<int> *)&b.mFront);
  return local_9a;
}

Assistant:

bool test8() {
  srand(0);
  CP::queue<int> a,b;
  int f1 = 200;
  int f2 = 10;
  int same = 900;
  int b1 = 100;
  int b2 = 10;
  for (int i = 0;i < f1;i++) a.push(rand());
  for (int i = 0;i < f2;i++) b.push(rand());
  for (int i = 0;i < same;i++) {
    int c = rand();
    a.push(c);
    b.push(c);
  }
  for (int i = 0;i < b1;i++) a.push(rand());
  for (int i = 0;i < b2;i++) b.push(rand());
  for (int i = 0;i < f1;i++) a.pop();
  for (int i = 0;i < f2;i++) b.pop();
  return ( ((a == b) == false)  && ((b == a) == false));
}